

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_clt_s_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int16_t iVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  fpr_t *pfVar4;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar2 = (env->active_fpu).fpr + wd;
  pfVar3 = (env->active_fpu).fpr + ws;
  pfVar4 = (env->active_fpu).fpr + wt;
  iVar1 = msa_clt_s_h(*(int16_t *)pfVar3,*(int16_t *)pfVar4);
  *(int16_t *)pfVar2 = iVar1;
  iVar1 = msa_clt_s_h(*(int16_t *)((long)pfVar3 + 2),*(int16_t *)((long)pfVar4 + 2));
  *(int16_t *)((long)pfVar2 + 2) = iVar1;
  iVar1 = msa_clt_s_h(*(int16_t *)((long)pfVar3 + 4),*(int16_t *)((long)pfVar4 + 4));
  *(int16_t *)((long)pfVar2 + 4) = iVar1;
  iVar1 = msa_clt_s_h(*(int16_t *)((long)pfVar3 + 6),*(int16_t *)((long)pfVar4 + 6));
  *(int16_t *)((long)pfVar2 + 6) = iVar1;
  iVar1 = msa_clt_s_h(*(int16_t *)((long)pfVar3 + 8),*(int16_t *)((long)pfVar4 + 8));
  *(int16_t *)((long)pfVar2 + 8) = iVar1;
  iVar1 = msa_clt_s_h(*(int16_t *)((long)pfVar3 + 10),*(int16_t *)((long)pfVar4 + 10));
  *(int16_t *)((long)pfVar2 + 10) = iVar1;
  iVar1 = msa_clt_s_h(*(int16_t *)((long)pfVar3 + 0xc),*(int16_t *)((long)pfVar4 + 0xc));
  *(int16_t *)((long)pfVar2 + 0xc) = iVar1;
  iVar1 = msa_clt_s_h(*(int16_t *)((long)pfVar3 + 0xe),*(int16_t *)((long)pfVar4 + 0xe));
  *(int16_t *)((long)pfVar2 + 0xe) = iVar1;
  return;
}

Assistant:

void helper_msa_clt_s_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_clt_s_h(pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_clt_s_h(pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_clt_s_h(pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_clt_s_h(pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_clt_s_h(pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_clt_s_h(pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_clt_s_h(pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_clt_s_h(pws->h[7],  pwt->h[7]);
}